

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O0

_Bool CheckGLExtension(char *name)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RDI;
  char *where;
  char *end;
  char *start;
  Display *display;
  char *local_20;
  
  if (CheckGLExtension::extensions == (char *)0x0) {
    lVar1 = glXGetCurrentDisplay();
    CheckGLExtension::extensions =
         (char *)glXQueryExtensionsString(lVar1,*(undefined4 *)(lVar1 + 0xe0));
  }
  if (CheckGLExtension::extensions != (char *)0x0) {
    local_20 = CheckGLExtension::extensions;
    do {
      pcVar2 = strstr(local_20,in_RDI);
      if (pcVar2 == (char *)0x0) {
        return false;
      }
      sVar3 = strlen(in_RDI);
      pcVar4 = pcVar2 + sVar3;
    } while (((pcVar2 != local_20) && (local_20 = pcVar4, pcVar2[-1] != ' ')) ||
            ((*pcVar4 != ' ' && (local_20 = pcVar4, *pcVar4 != '\0'))));
  }
  return true;
}

Assistant:

static bool
CheckGLExtension(const char *name) {
    static const char *extensions = 0x0;

    if (extensions == 0x0) {
#if defined(_WIN32) || defined(WIN32)
        // TODO: This is deprecated on OpenGL 3+.
        // Use glGetIntegerv(GL_NUM_EXTENSIONS, &n) and glGetStringi(GL_EXTENSIONS, index)
        extensions = (const char *) glGetString(GL_EXTENSIONS);
#elif defined(linux)
        Display *display = glXGetCurrentDisplay();

        extensions = glXQueryExtensionsString(display, DefaultScreen(display));
#endif
    }

    if (extensions != 0x0) {
        const char *start = extensions;
        const char *end, *where;
        while(1) {
            where = strstr(start, name);
            if(where == 0x0)
                return false;

            end = where + strlen(name);
            if (where == start || *(where - 1) == ' ') {
                if (*end == ' ' || *end == 0)
                    break;
            }

            start = end;
        }
    }

    return true;
}